

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::simplifyDB(Engine *this)

{
  uint uVar1;
  int iVar2;
  Propagator **ppPVar3;
  vec<IntVar_*> *in_RDI;
  uint i_1;
  uint i;
  int cost;
  uint local_14;
  uint uVar4;
  uint index;
  int iVar5;
  
  iVar5 = 0;
  uVar4 = 0;
  while( true ) {
    index = uVar4;
    uVar1 = vec<Propagator_*>::size((vec<Propagator_*> *)(in_RDI + 2));
    if (uVar1 <= uVar4) break;
    ppPVar3 = vec<Propagator_*>::operator[]((vec<Propagator_*> *)(in_RDI + 2),index);
    iVar2 = (*(*ppPVar3)->_vptr_Propagator[7])();
    iVar5 = iVar2 + iVar5;
    uVar4 = index + 1;
  }
  uVar4 = vec<Propagator_*>::size((vec<Propagator_*> *)(in_RDI + 2));
  iVar5 = uVar4 + iVar5;
  local_14 = 0;
  while( true ) {
    uVar4 = vec<IntVar_*>::size(in_RDI);
    if (uVar4 <= local_14) break;
    vec<IntVar_*>::operator[](in_RDI,local_14);
    iVar2 = IntVar::simplifyWatches((IntVar *)CONCAT44(iVar5,index));
    iVar5 = iVar2 + iVar5;
    local_14 = local_14 + 1;
  }
  uVar4 = vec<IntVar_*>::size(in_RDI);
  in_RDI[0x13].data = (IntVar **)((long)in_RDI[0x12].data + (long)(int)((uVar4 + iVar5) * 10));
  return;
}

Assistant:

void Engine::simplifyDB() {
	int cost = 0;
	for (unsigned int i = 0; i < propagators.size(); i++) {
		cost += propagators[i]->checkSatisfied();
	}
	cost += propagators.size();
	for (unsigned int i = 0; i < vars.size(); i++) {
		cost += vars[i]->simplifyWatches();
	}
	cost += vars.size();
	cost *= 10;
	//  printf("simp db cost: %d\n", cost);
	next_simp_db = propagations + cost;
}